

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffm_score_test.cc
# Opt level: O3

void __thiscall xLearn::FFMScore_Test_calc_score_Test::TestBody(FFMScore_Test_calc_score_Test *this)

{
  real_t *prVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined8 uVar16;
  undefined8 uVar17;
  byte bVar18;
  bool bVar19;
  uint uVar20;
  index_t iVar21;
  ulong uVar22;
  undefined1 (*pauVar23) [16];
  long lVar24;
  index_t iVar25;
  index_t f;
  index_t iVar26;
  char *message;
  uint uVar27;
  ushort uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  real_t expected;
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined4 in_XMM14_Da;
  undefined1 in_register_00001584 [12];
  SparseRow row;
  AssertionResult gtest_ar;
  Model model;
  FFMScore score;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_378;
  float local_36c;
  undefined1 local_368 [16];
  pointer local_358;
  internal local_350 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_348;
  _func_int **local_340;
  AssertHelper local_338;
  Model local_330;
  FFMScore local_2a0;
  HyperParam local_240;
  
  iVar21 = 1;
  local_340 = (_func_int **)&PTR__Score_0014e448;
  do {
    HyperParam::HyperParam(&local_240);
    local_240._148_8_ = SUB648(ZEXT464(0x3dcccccd),0);
    std::__cxx11::string::_M_replace
              ((ulong)&local_240.loss_func,0,(char *)local_240.loss_func._M_string_length,0x13e2d9);
    std::__cxx11::string::_M_replace
              ((ulong)&local_240.score_func,0,(char *)local_240.score_func._M_string_length,0x13e2e1
              );
    local_358 = (pointer)0x0;
    local_240.num_feature = 3;
    local_368 = (undefined1  [16])0x0;
    local_240.num_field = 3;
    local_240.num_K = iVar21;
    local_368._0_8_ = operator_new(0x24);
    auVar45._8_4_ = 0x40000000;
    auVar45._0_8_ = 0x4000000040000000;
    auVar45._12_4_ = 0x40000000;
    auVar45._16_4_ = 0x40000000;
    auVar45._20_4_ = 0x40000000;
    auVar45._24_4_ = 0x40000000;
    auVar45._28_4_ = 0x40000000;
    auVar32 = vpbroadcastq_avx512f(ZEXT816(0xc));
    auVar33 = vpbroadcastq_avx512f(ZEXT816(0x10));
    auVar34 = vpbroadcastd_avx512f(ZEXT416(0x10));
    local_358 = (pointer)(local_368._0_8_ + 0x24);
    local_368._8_8_ = local_358;
    if ((ulong)local_240.num_feature != 0) {
      auVar35 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar36 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar37 = vpmovsxbd_avx512f(_DAT_0013e260);
      auVar38 = vpbroadcastq_avx512f();
      uVar22 = (ulong)local_240.num_feature + 0xf & 0x1fffffff0;
      auVar39 = vpbroadcastq_avx512f();
      do {
        auVar40 = vpmullq_avx512dq(auVar35,auVar32);
        auVar41 = vpmullq_avx512dq(auVar36,auVar32);
        uVar16 = vpcmpuq_avx512f(auVar35,auVar39,2);
        uVar17 = vpcmpuq_avx512f(auVar36,auVar39,2);
        auVar31 = vextracti64x4_avx512f(auVar37,1);
        auVar35 = vpaddq_avx512f(auVar35,auVar33);
        auVar36 = vpaddq_avx512f(auVar36,auVar33);
        uVar22 = uVar22 - 0x10;
        auVar42 = vpaddq_avx512f(auVar38,auVar40);
        auVar43 = vpaddq_avx512f(auVar38,auVar41);
        vpscatterqd_avx512f(ZEXT832(4) + auVar42._0_32_,uVar16,auVar37._0_32_);
        vpscatterqd_avx512f(ZEXT832(4) + auVar43._0_32_,uVar17,auVar31);
        vscatterqps_avx512f(ZEXT864(8) + auVar42,uVar16,auVar45);
        vscatterqps_avx512f(ZEXT864(8) + auVar43,uVar17,auVar45);
        vpscatterqd_avx512f(ZEXT832((ulong)local_368._0_8_) + auVar40._0_32_,uVar16,auVar37._0_32_);
        auVar37 = vpaddd_avx512f(auVar37,auVar34);
        vpscatterqd_avx512f(ZEXT832((ulong)local_368._0_8_) + auVar41._0_32_,uVar17,auVar31);
      } while (uVar22 != 0);
    }
    local_330.score_func_._M_dataplus._M_p = (pointer)&local_330.score_func_.field_2;
    local_330.loss_func_._M_dataplus._M_p = (pointer)&local_330.loss_func_.field_2;
    local_330.score_func_._M_string_length = 0;
    local_330.score_func_.field_2._M_local_buf[0] = '\0';
    local_330.loss_func_._M_string_length = 0;
    local_330.loss_func_.field_2._M_local_buf[0] = '\0';
    local_330.param_best_v_ = (real_t *)0x0;
    local_330.param_best_b_ = (real_t *)0x0;
    local_330.param_w_ = (real_t *)0x0;
    local_330.param_v_ = (real_t *)0x0;
    local_330.param_b_ = (real_t *)0x0;
    local_330.param_best_w_ = (real_t *)0x0;
    Model::Initialize(&local_330,&local_240.score_func,&local_240.loss_func,local_240.num_feature,
                      local_240.num_field,local_240.num_K,2,1.0);
    auVar32 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
    auVar33 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar34 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    if ((ulong)local_330.param_num_w_ != 0) {
      auVar35 = vpbroadcastq_avx512f();
      uVar22 = 0;
      do {
        auVar36 = vpbroadcastq_avx512f();
        auVar37 = vporq_avx512f(auVar36,auVar33);
        auVar36 = vporq_avx512f(auVar36,auVar34);
        uVar16 = vpcmpuq_avx512f(auVar36,auVar35,2);
        uVar17 = vpcmpuq_avx512f(auVar37,auVar35,2);
        bVar18 = (byte)uVar17;
        uVar28 = CONCAT11(bVar18,(byte)uVar16);
        prVar1 = local_330.param_w_ + uVar22;
        bVar19 = (bool)((byte)uVar16 & 1);
        bVar2 = (bool)((byte)(uVar28 >> 1) & 1);
        bVar3 = (bool)((byte)(uVar28 >> 2) & 1);
        bVar4 = (bool)((byte)(uVar28 >> 3) & 1);
        bVar5 = (bool)((byte)(uVar28 >> 4) & 1);
        bVar6 = (bool)((byte)(uVar28 >> 5) & 1);
        bVar7 = (bool)((byte)(uVar28 >> 6) & 1);
        bVar8 = (bool)((byte)(uVar28 >> 7) & 1);
        bVar9 = (bool)(bVar18 >> 1 & 1);
        bVar10 = (bool)(bVar18 >> 2 & 1);
        bVar11 = (bool)(bVar18 >> 3 & 1);
        bVar12 = (bool)(bVar18 >> 4 & 1);
        bVar13 = (bool)(bVar18 >> 5 & 1);
        bVar14 = (bool)(bVar18 >> 6 & 1);
        *prVar1 = (real_t)((uint)bVar19 * auVar32._0_4_ | (uint)!bVar19 * (int)*prVar1);
        prVar1[1] = (real_t)((uint)bVar2 * auVar32._4_4_ | (uint)!bVar2 * (int)prVar1[1]);
        prVar1[2] = (real_t)((uint)bVar3 * auVar32._8_4_ | (uint)!bVar3 * (int)prVar1[2]);
        prVar1[3] = (real_t)((uint)bVar4 * auVar32._12_4_ | (uint)!bVar4 * (int)prVar1[3]);
        prVar1[4] = (real_t)((uint)bVar5 * auVar32._16_4_ | (uint)!bVar5 * (int)prVar1[4]);
        prVar1[5] = (real_t)((uint)bVar6 * auVar32._20_4_ | (uint)!bVar6 * (int)prVar1[5]);
        prVar1[6] = (real_t)((uint)bVar7 * auVar32._24_4_ | (uint)!bVar7 * (int)prVar1[6]);
        prVar1[7] = (real_t)((uint)bVar8 * auVar32._28_4_ | (uint)!bVar8 * (int)prVar1[7]);
        prVar1[8] = (real_t)((uint)(bVar18 & 1) * auVar32._32_4_ |
                            (uint)!(bool)(bVar18 & 1) * (int)prVar1[8]);
        prVar1[9] = (real_t)((uint)bVar9 * auVar32._36_4_ | (uint)!bVar9 * (int)prVar1[9]);
        prVar1[10] = (real_t)((uint)bVar10 * auVar32._40_4_ | (uint)!bVar10 * (int)prVar1[10]);
        prVar1[0xb] = (real_t)((uint)bVar11 * auVar32._44_4_ | (uint)!bVar11 * (int)prVar1[0xb]);
        prVar1[0xc] = (real_t)((uint)bVar12 * auVar32._48_4_ | (uint)!bVar12 * (int)prVar1[0xc]);
        prVar1[0xd] = (real_t)((uint)bVar13 * auVar32._52_4_ | (uint)!bVar13 * (int)prVar1[0xd]);
        prVar1[0xe] = (real_t)((uint)bVar14 * auVar32._56_4_ | (uint)!bVar14 * (int)prVar1[0xe]);
        prVar1[0xf] = (real_t)((uint)(bVar18 >> 7) * auVar32._60_4_ |
                              (uint)!(bool)(bVar18 >> 7) * (int)prVar1[0xf]);
        uVar22 = uVar22 + 0x10;
      } while (((ulong)local_330.param_num_w_ + 0xf & 0x1fffffff0) != uVar22);
    }
    auVar29._4_12_ = in_register_00001584;
    auVar29._0_4_ = in_XMM14_Da;
    auVar29 = vcvtusi2ss_avx512f(auVar29,local_330.num_K_);
    if (local_330.num_feat_ != 0) {
      auVar29 = ZEXT416((uint)(auVar29._0_4_ * 0.25));
      auVar29 = vroundss_avx(auVar29,auVar29,10);
      uVar20 = vcvttss2usi_avx512f(auVar29);
      auVar29 = vpbroadcastd_avx512vl();
      iVar25 = 0;
      pauVar23 = (undefined1 (*) [16])local_330.param_v_;
      do {
        if (local_330.num_field_ != 0) {
          iVar26 = 0;
          do {
            if ((uVar20 & 0x3fffffff) != 0) {
              auVar44._8_4_ = 0x3f800000;
              auVar44._0_8_ = 0x3f8000003f800000;
              auVar44._12_4_ = 0x3f800000;
              auVar15 = vpmovsxbd_avx(ZEXT416(0x3020100));
              uVar27 = 0;
              do {
                auVar30 = vpbroadcastd_avx512vl();
                uVar27 = uVar27 + 4;
                auVar30 = vpor_avx(auVar30,auVar15);
                uVar22 = vpcmpud_avx512vl(auVar30,auVar29,1);
                uVar22 = uVar22 & 0xf;
                auVar30._4_4_ = (uint)((byte)(uVar22 >> 1) & 1) * 0x3f800000;
                auVar30._0_4_ = (uint)((byte)uVar22 & 1) * 0x3f800000;
                auVar30._8_4_ = (uint)((byte)(uVar22 >> 2) & 1) * 0x3f800000;
                auVar30._12_4_ = (uint)(byte)(uVar22 >> 3) * 0x3f800000;
                *pauVar23 = auVar30;
                pauVar23[1] = auVar44;
                pauVar23 = pauVar23 + 2;
              } while (uVar27 < uVar20 << 2);
            }
            iVar26 = iVar26 + 1;
          } while (iVar26 != local_330.num_field_);
        }
        iVar25 = iVar25 + 1;
      } while (iVar25 != local_330.num_feat_);
    }
    local_2a0.super_Score.opt_type_._M_dataplus._M_p =
         (pointer)&local_2a0.super_Score.opt_type_.field_2;
    lVar24 = 10;
    *local_330.param_b_ = 0.0;
    local_2a0.super_Score.opt_type_._M_string_length = 0;
    local_2a0.super_Score.opt_type_.field_2._M_local_buf[0] = '\0';
    local_2a0.super_Score._vptr_Score = local_340;
    local_2a0.comp_res1 = (real_t *)0x0;
    local_2a0.comp_res2 = (real_t *)0x0;
    local_2a0.comp_z_lt_zero = (real_t *)0x0;
    local_2a0.comp_z_gt_zero = (real_t *)0x0;
    local_36c = (float)(int)(iVar21 * 0xc + 6);
    do {
      expected = FFMScore::CalcScore(&local_2a0,(SparseRow *)local_368,&local_330,1.0);
      testing::internal::CmpHelperFloatingPointEQ<float>
                (local_350,"val","6+k*4*3",expected,local_36c);
      if (local_350[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_378);
        message = "";
        if (local_348.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = ((local_348.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_338,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/score/ffm_score_test.cc"
                   ,0x4f,message);
        testing::internal::AssertHelper::operator=(&local_338,(Message *)&local_378);
        testing::internal::AssertHelper::~AssertHelper(&local_338);
        if (local_378.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar19 = testing::internal::IsTrue(true);
          if ((bVar19) &&
             (local_378.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_378.ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_348,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      lVar24 = lVar24 + -1;
    } while (lVar24 != 0);
    local_2a0.super_Score._vptr_Score = (_func_int **)&PTR__Score_0014e3c0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0.super_Score.opt_type_._M_dataplus._M_p !=
        &local_2a0.super_Score.opt_type_.field_2) {
      operator_delete(local_2a0.super_Score.opt_type_._M_dataplus._M_p);
    }
    Model::~Model(&local_330);
    if ((pointer)local_368._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_368._0_8_);
    }
    HyperParam::~HyperParam(&local_240);
    iVar21 = iVar21 + 1;
  } while (iVar21 != 100);
  return;
}

Assistant:

TEST(FFMScore_Test, calc_score) {
  for (index_t k = 1; k < 100; ++k) {
    // Init hyper_param
    HyperParam param;
    param.learning_rate = 0.1;
    param.regu_lambda = 0;
    param.loss_func = "squared";
    param.score_func = "ffm";
    param.num_feature = 3;
    param.num_K = k;
    param.num_field = 3;
    // Init SparseRow
    SparseRow row(param.num_feature);
    for (index_t i = 0; i < param.num_feature; ++i) {
      row[i].feat_id = i;
      row[i].feat_val = 2.0;
      row[i].field_id = i;
    }
    // Init model
    Model model;
    model.Initialize(param.score_func,
                param.loss_func,
                param.num_feature,
                param.num_field,
                param.num_K, 2);
    real_t* w = model.GetParameter_w();
    index_t num_w = model.GetNumParameter_w();
    for (index_t i = 0; i < num_w; ++i) {
      w[i] = 1.0;
    }
    real_t* v = model.GetParameter_v();
    index_t k_aligned = model.get_aligned_k();
    for (index_t j = 0; j < model.GetNumFeature(); ++j) {
      for (index_t f = 0; f < model.GetNumField(); ++f) {
        for (index_t d = 0; d < k_aligned; ) {
          for (index_t s = 0; s < kAlign; s++, v++, d++) {
            v[0] = (d < model.GetNumK()) ? 1.0 : 0.0;
            v[kAlign] = 1.0;
          }
          v += kAlign;
        }
      }
    }
    model.GetParameter_b()[0] = 0.0;
    FFMScore score;
    for (size_t i = 0; i < 10; ++i) {
      real_t val = score.CalcScore(&row, model);
      // 6 + 24*4*3 = 294
      EXPECT_FLOAT_EQ(val, 6+k*4*3);
    }
  }
}